

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::SyncToSetAndConsumeInst<false>::Exec
          (SyncToSetAndConsumeInst<false> *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  CharCount CVar1;
  bool bVar2;
  RuntimeCharSet<char16_t> *matchSet;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  SyncToSetAndConsumeInst<false> *this_local;
  
  Matcher::CompStats(matcher);
  while( true ) {
    bVar2 = false;
    if (*inputOffset < inputLength) {
      bVar2 = RuntimeCharSet<char16_t>::Get(&(this->super_SetMixin<false>).set,input[*inputOffset]);
      bVar2 = !bVar2;
    }
    if (!bVar2) break;
    Matcher::CompStats(matcher);
    *inputOffset = *inputOffset + 1;
  }
  if (*inputOffset < inputLength) {
    CVar1 = *inputOffset;
    *inputOffset = CVar1 + 1;
    *matchStart = CVar1;
    *instPointer = *instPointer + 0x29;
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         Matcher::HardFail(matcher,input,inputLength,matchStart,inputOffset,instPointer,contStack,
                           assertionStack,qcTicks,ImmediateFail);
  }
  return this_local._7_1_;
}

Assistant:

inline bool SyncToSetAndConsumeInst<IsNegation>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        const RuntimeCharSet<Char>& matchSet = this->set;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        while (inputOffset < inputLength && matchSet.Get(input[inputOffset]) == IsNegation)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        if (inputOffset >= inputLength)
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        matchStart = inputOffset++;
        instPointer += sizeof(*this);
        return false;
    }